

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

int __thiscall
helics::zeromq::ZmqComms::initializeBrokerConnections(ZmqComms *this,socket_t *controlSocket)

{
  string *networkInterface;
  socket_base sVar1;
  bool bVar2;
  int iVar3;
  ActionMessage *data;
  size_t size;
  string *address;
  size_t in_RCX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  GlobalFederateId __fd;
  context_t *context_;
  int in_R8D;
  int iVar5;
  bool bVar6;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  int local_400;
  socket_t brokerReq;
  allocator<char> local_3d0 [32];
  ulong local_3b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  shared_ptr<ZmqContextManager> ctx;
  ActionMessage M_1;
  pollitem_t poller;
  ActionMessage M_4;
  string str;
  ActionMessage getPorts;
  message_t msg;
  undefined8 uVar4;
  
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar3 = getDefaultPort(1);
      LOCK();
      (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar3;
      UNLOCK();
      ActionMessage::ActionMessage(&getPorts,cmd_protocol);
      getPorts.messageID = 0x5ab;
      getPorts.dest_handle.hid =
           (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
      ActionMessage::to_string_abi_cxx11_((string *)&M_1,&getPorts);
      zmq::detail::socket_base::send
                (&controlSocket->super_socket_base,(int)&M_1,(void *)0x0,in_RCX,in_R8D);
      std::__cxx11::string::~string((string *)&M_1);
      ActionMessage::~ActionMessage(&getPorts);
    }
  }
  else {
    getPorts._0_8_ = &getPorts.dest_id;
    getPorts.source_id.gid = 0;
    getPorts.source_handle.hid = 0;
    getPorts.dest_id.gid._0_1_ = 0;
    ZmqContextManager::getContextPointer((ZmqContextManager *)&ctx,(string *)&getPorts);
    std::__cxx11::string::~string((string *)&getPorts);
    if ((this->super_NetworkCommsInterface).brokerPort < 0) {
      iVar3 = getDefaultPort(1);
      (this->super_NetworkCommsInterface).brokerPort = iVar3;
    }
    zmq::socket_t::socket_t
              (&brokerReq,
               ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               zcontext)._M_t.
               super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
               super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
               super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,3);
    getPorts.messageAction = cmd_add_publisher;
    zmq::detail::socket_base::setsockopt<int>
              (&brokerReq.super_socket_base,0x11,&getPorts.messageAction);
    networkInterface = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress
    ;
    gmlc::networking::makePortAddress
              ((string *)&getPorts,networkInterface,
               (this->super_NetworkCommsInterface).brokerPort + 1);
    data = (ActionMessage *)getPorts._0_8_;
    zmq::detail::socket_base::connect
              (&brokerReq.super_socket_base,getPorts.messageAction,__addr,(socklen_t)in_RCX);
    std::__cxx11::string::~string((string *)&getPorts);
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
    zmq::message_t::message_t(&msg);
    iVar3 = (int)data;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar5 = 0;
      local_3b0 = 0;
      do {
        iVar3 = (int)data;
        bVar6 = -1 < (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
        in_RCX = CONCAT71((int7)(in_RCX >> 8),bVar6);
        if (bVar6) {
          bVar6 = true;
          break;
        }
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) != 0) {
          ActionMessage::ActionMessage(&getPorts,cmd_protocol);
          getPorts.messageID = 0x9db;
          ActionMessage::to_string_abi_cxx11_((string *)&M_1,&getPorts);
          iVar3 = (int)&M_1;
          zmq::detail::socket_base::send
                    (&controlSocket->super_socket_base,iVar3,(void *)0x0,in_RCX,in_R8D);
          std::__cxx11::string::~string((string *)&M_1);
          ActionMessage::~ActionMessage(&getPorts);
          local_400 = -3;
          bVar6 = false;
          break;
        }
        NetworkCommsInterface::generatePortRequest
                  (&getPorts,&this->super_NetworkCommsInterface,
                   (this->super_NetworkCommsInterface).super_CommsInterface.serverMode + 1);
        if ((this->super_NetworkCommsInterface).super_CommsInterface.useJsonSerialization == false)
        {
          ActionMessage::to_string_abi_cxx11_(&str,&getPorts);
        }
        else {
          getPorts.flags._0_1_ = (byte)getPorts.flags | 0x40;
          ActionMessage::to_json_string_abi_cxx11_(&str,&getPorts);
        }
        zmq::detail::socket_base::send
                  (&brokerReq.super_socket_base,(int)&str,(void *)0x0,in_RCX,in_R8D);
        poller.socket = brokerReq.super_socket_base._handle;
        poller.events = 1;
        iVar3 = zmq::poll((pollfd *)&poller,1,
                          (int)(this->super_NetworkCommsInterface).super_CommsInterface.
                               connectionTimeout.__r);
        if (iVar3 < 0) {
          message._M_str = "ZMQ broker connection error (2)";
          message._M_len = 0x1f;
          CommsInterface::logError((CommsInterface *)this,message);
LAB_002616a3:
          data = (ActionMessage *)0x4;
          CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
LAB_002616ae:
          if ((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i == ERRORED) {
LAB_002616be:
            ActionMessage::ActionMessage(&M_1,cmd_protocol);
            M_1.messageID = 0xa3f;
            ActionMessage::to_string_abi_cxx11_((string *)&M_4,&M_1);
            data = &M_4;
            zmq::detail::socket_base::send
                      (&controlSocket->super_socket_base,(int)&M_4,(void *)0x0,in_RCX,in_R8D);
            std::__cxx11::string::~string((string *)&M_4);
            ActionMessage::~ActionMessage(&M_1);
            local_400 = -1;
LAB_00261793:
            bVar2 = false;
          }
          else {
LAB_00261ad6:
            iVar3 = (int)local_3b0;
            bVar2 = (this->super_NetworkCommsInterface).maxRetries <= iVar3;
            if (bVar2) {
              data = (ActionMessage *)0x4;
              CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
              local_400 = -1;
            }
            local_3b0 = (ulong)(iVar3 + 1);
            bVar2 = !bVar2;
          }
        }
        else {
          if (iVar3 == 0) {
            if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base.
                 _M_i & 1U) == 0) {
              if (iVar5 == 0) {
                message_01._M_str = "zmq broker connection timed out, trying again (2)";
                message_01._M_len = 0x31;
                CommsInterface::logWarning((CommsInterface *)this,message_01);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&M_4,"sending message to ",local_3d0);
                gmlc::networking::makePortAddress
                          (&brkprt.first,networkInterface,
                           (this->super_NetworkCommsInterface).brokerPort + 1);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &M_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&M_4,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &brkprt);
                message_02._M_str = (char *)M_1._0_8_;
                message_02._M_len._0_4_ = M_1.source_id.gid;
                message_02._M_len._4_4_ = M_1.source_handle.hid;
                uVar4 = M_1._8_8_;
                CommsInterface::logWarning((CommsInterface *)this,message_02);
                __fd.gid = (BaseType)uVar4;
                std::__cxx11::string::~string((string *)&M_1);
                std::__cxx11::string::~string((string *)&brkprt);
                std::__cxx11::string::~string((string *)&M_4);
              }
              else {
                __fd.gid = (this->super_NetworkCommsInterface).maxRetries;
                if (__fd.gid <= iVar5) {
                  CLI::std::__cxx11::to_string((string *)&brkprt,__fd.gid);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&M_4,"zmq broker connection timed out after trying ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&brkprt);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&M_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&M_4," times (2)");
                  message_00._M_str = (char *)M_1._0_8_;
                  message_00._M_len._0_4_ = M_1.source_id.gid;
                  message_00._M_len._4_4_ = M_1.source_handle.hid;
                  CommsInterface::logError((CommsInterface *)this,message_00);
                  std::__cxx11::string::~string((string *)&M_1);
                  std::__cxx11::string::~string((string *)&M_4);
                  std::__cxx11::string::~string((string *)&brkprt);
                  goto LAB_002616a3;
                }
              }
              zmq::socket_t::close(&brokerReq,__fd.gid);
              context_ = ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->zcontext)._M_t.
                         super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>
                         .super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl;
              zmq::socket_t::socket_t((socket_t *)&M_1,context_,3);
              in_RCX = M_1._0_8_;
              sVar1 = brokerReq.super_socket_base;
              brokerReq.super_socket_base._handle = (void *)M_1._0_8_;
              M_1._0_8_ = sVar1._handle;
              zmq::socket_t::close((socket_t *)&M_1,(int)context_);
              M_1.messageAction = cmd_add_publisher;
              zmq::detail::socket_base::setsockopt<int>
                        (&brokerReq.super_socket_base,0x11,&M_1.messageAction);
              gmlc::networking::makePortAddress
                        ((string *)&M_1,networkInterface,
                         (this->super_NetworkCommsInterface).brokerPort + 1);
              data = (ActionMessage *)M_1._0_8_;
              zmq::detail::socket_base::connect
                        (&brokerReq.super_socket_base,M_1.messageAction,__addr_00,(socklen_t)in_RCX)
              ;
              std::__cxx11::string::~string((string *)&M_1);
              poller.socket = brokerReq.super_socket_base._handle;
              goto LAB_002616ae;
            }
            ActionMessage::ActionMessage(&M_1,cmd_protocol);
            M_1.messageID = 0x9db;
            ActionMessage::to_string_abi_cxx11_((string *)&M_4,&M_1);
            data = &M_4;
            zmq::detail::socket_base::send
                      (&controlSocket->super_socket_base,(int)&M_4,(void *)0x0,in_RCX,in_R8D);
            std::__cxx11::string::~string((string *)&M_4);
            ActionMessage::~ActionMessage(&M_1);
            local_400 = -3;
            goto LAB_00261793;
          }
          if ((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i == ERRORED)
          goto LAB_002616be;
          zmq::detail::socket_base::recv
                    (&brokerReq.super_socket_base,(int)&msg,(void *)0x0,in_RCX,in_R8D);
          data = (ActionMessage *)zmq::message_t::data(&msg);
          size = zmq::message_t::size(&msg);
          ActionMessage::ActionMessage(&M_1,data,size);
          bVar2 = true;
          if (((M_1.messageAction == cmd_protocol_priority) ||
              (M_1.messageAction == cmd_protocol_big)) || (M_1.messageAction == cmd_protocol)) {
            if (M_1.messageID == 0x14d) {
              message_03._M_str = "got new broker information";
              message_03._M_len = 0x1a;
              CommsInterface::logMessage((CommsInterface *)this,message_03);
              gmlc::networking::makePortAddress
                        ((string *)&M_4,networkInterface,
                         (this->super_NetworkCommsInterface).brokerPort + 1);
              zmq::detail::socket_base::disconnect(&brokerReq.super_socket_base,(char *)M_4._0_8_);
              std::__cxx11::string::~string((string *)&M_4);
              address = ActionMessage::getString_abi_cxx11_(&M_1,0);
              gmlc::networking::extractInterfaceAndPort(&brkprt,address);
              (this->super_NetworkCommsInterface).brokerPort = brkprt.second;
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&brkprt,"?");
              if (!bVar2) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            networkInterface,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &brkprt);
              }
              gmlc::networking::makePortAddress
                        ((string *)&M_4,networkInterface,
                         (this->super_NetworkCommsInterface).brokerPort + 1);
              data = (ActionMessage *)M_4._0_8_;
              zmq::detail::socket_base::connect
                        (&brokerReq.super_socket_base,M_4.messageAction,__addr_01,(socklen_t)in_RCX)
              ;
              std::__cxx11::string::~string((string *)&M_4);
              bVar2 = true;
              std::__cxx11::string::~string((string *)&brkprt);
            }
            else if (M_1.messageID == 0xed3) {
              M_4.messageAction = cmd_user_disconnect;
              M_4.messageID = 0;
              std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                        ((duration<long,_std::ratio<1L,_1L>_> *)&M_4);
            }
            else {
              if (M_1.messageID == 0x9db) {
                zmq::detail::socket_base::send
                          (&controlSocket->super_socket_base,(int)&msg,(void *)0x0,in_RCX,in_R8D);
                data = (ActionMessage *)0x2;
                CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
                local_400 = -3;
              }
              else {
                if (M_1.messageID != 0xa3f) {
                  if (M_1.messageID == 0x5ab) {
                    bVar2 = false;
                    data = (ActionMessage *)&msg;
                    zmq::detail::socket_base::send
                              (&controlSocket->super_socket_base,(int)data,(void *)0x0,in_RCX,in_R8D
                              );
                    local_400 = 0;
                  }
                  goto LAB_00261ac4;
                }
                zmq::detail::socket_base::send
                          (&controlSocket->super_socket_base,(int)&msg,(void *)0x0,in_RCX,in_R8D);
                data = (ActionMessage *)0x4;
                CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
                local_400 = -4;
              }
              bVar2 = false;
            }
          }
LAB_00261ac4:
          ActionMessage::~ActionMessage(&M_1);
          if (bVar2) goto LAB_00261ad6;
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&str);
        ActionMessage::~ActionMessage(&getPorts);
        iVar3 = (int)data;
        iVar5 = iVar5 + 1;
      } while (bVar2);
    }
    else {
      bVar6 = true;
    }
    zmq::message_t::~message_t(&msg);
    zmq::socket_t::close(&brokerReq,iVar3);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar6) {
      return local_400;
    }
  }
  return 0;
}

Assistant:

int ZmqComms::initializeBrokerConnections(zmq::socket_t& controlSocket)
{
    zmq::pollitem_t poller;
    if (hasBroker) {
        auto ctx = ZmqContextManager::getContextPointer();
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }

        zmq::socket_t brokerReq(ctx->getBaseContext(), ZMQ_REQ);
        brokerReq.setsockopt(ZMQ_LINGER, 50);
        try {
            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
        }
        catch (zmq::error_t& ze) {
            logError(std::string("unable to connect with broker at ") +
                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" + name + ")" +
                     ze.what());
            setTxStatus(ConnectionStatus::ERRORED);
            ActionMessage M(CMD_PROTOCOL);
            M.messageID = DISCONNECT_ERROR;
            controlSocket.send(M.to_string());
            return (-1);
        }

        hasBroker = true;
        zmq::message_t msg;
        if (PortNumber < 0) {
            int cnt = 0;

            int cnt2 = 0;
            while (PortNumber < 0) {
                if (requestDisconnect.load(std::memory_order_acquire)) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT;
                    controlSocket.send(M.to_string());
                    return (-3);
                }
                ActionMessage getPorts = generatePortRequest((serverMode) ? 2 : 1);
                if (useJsonSerialization) {
                    setActionFlag(getPorts, use_json_serialization_flag);
                }
                auto str =
                    (useJsonSerialization) ? getPorts.to_json_string() : getPorts.to_string();

                brokerReq.send(str);
                poller.socket = static_cast<void*>(brokerReq);
                poller.events = ZMQ_POLLIN;
                int rc = 0;
                while (rc == 0) {
                    ++cnt2;
                    rc = zmq::poll(&poller, 1, connectionTimeout);
                    if (rc < 0) {
                        logError("ZMQ broker connection error (2)");
                        setTxStatus(ConnectionStatus::ERRORED);
                        break;
                    }
                    if (rc == 0) {
                        if (requestDisconnect.load(std::memory_order_acquire)) {
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT;
                            controlSocket.send(M.to_string());
                            return (-3);
                        }
                        if (cnt2 == 1) {
                            logWarning("zmq broker connection timed out, trying again (2)");
                            logWarning(std::string("sending message to ") +
                                       makePortAddress(brokerTargetAddress, brokerPort + 1));
                        } else if (cnt2 > maxRetries) {
                            logError("zmq broker connection timed out after trying " +
                                     std::to_string(maxRetries) + " times (2)");
                            setTxStatus(ConnectionStatus::ERRORED);
                            break;
                        }
                        // try to reestablish the connection
                        brokerReq.close();
                        brokerReq = zmq::socket_t(ctx->getBaseContext(), ZMQ_REQ);
                        brokerReq.setsockopt(ZMQ_LINGER, 50);
                        try {
                            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
                            poller.socket = static_cast<void*>(brokerReq);
                        }
                        catch (zmq::error_t& ze) {
                            logError(std::string("unable to connect with broker at ") +
                                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" +
                                     name + ")" + ze.what());
                            setTxStatus(ConnectionStatus::ERRORED);
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT_ERROR;
                            controlSocket.send(M.to_string());
                            return (-1);
                        }
                        break;
                    }
                }

                if (getTxStatus() == ConnectionStatus::ERRORED) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT_ERROR;
                    controlSocket.send(M.to_string());
                    return (-1);
                }
                if (rc > 0) {
                    brokerReq.recv(msg);

                    ActionMessage rxcmd(static_cast<std::byte*>(msg.data()), msg.size());
                    if (isProtocolCommand(rxcmd)) {
                        if (rxcmd.messageID == PORT_DEFINITIONS) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            return 0;
                        }
                        if (rxcmd.messageID == DISCONNECT) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::TERMINATED);
                            return (-3);
                        }
                        if (rxcmd.messageID == DISCONNECT_ERROR) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::ERRORED);
                            return (-4);
                        }
                        if (rxcmd.messageID == NEW_BROKER_INFORMATION) {
                            logMessage("got new broker information");
                            brokerReq.disconnect(
                                makePortAddress(brokerTargetAddress, brokerPort + 1));
                            auto brkprt =
                                gmlc::networking::extractInterfaceAndPort(rxcmd.getString(0));
                            brokerPort = brkprt.second;
                            if (brkprt.first != "?") {
                                brokerTargetAddress = brkprt.first;
                            }
                            try {
                                brokerReq.connect(
                                    makePortAddress(brokerTargetAddress, brokerPort + 1));
                            }
                            catch (zmq::error_t& ze) {
                                logError(std::string("unable to connect with broker at ") +
                                         makePortAddress(brokerTargetAddress, brokerPort + 1) +
                                         ":(" + name + ")" + ze.what());
                                setTxStatus(ConnectionStatus::ERRORED);
                                ActionMessage M(CMD_PROTOCOL);
                                M.messageID = DISCONNECT_ERROR;
                                controlSocket.send(M.to_string());
                                return (-1);
                            }
                        } else if (rxcmd.messageID == DELAY_CONNECTION) {
                            std::this_thread::sleep_for(std::chrono::seconds(2));
                        }
                    }
                }
                ++cnt;
                if (cnt > maxRetries) {
                    // we can't get the broker to respond with port numbers
                    setTxStatus(ConnectionStatus::ERRORED);
                    return (-1);
                }
            }
        }
    } else {
        if ((PortNumber < 0)) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage setPorts(CMD_PROTOCOL);
            setPorts.messageID = PORT_DEFINITIONS;
            setPorts.setExtraData(PortNumber);
            auto str = setPorts.to_string();
            controlSocket.send(str);
        }
    }
    return 0;
}